

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O3

bool __thiscall pobr::imgProcessing::structs::Segment::isLetterT(Segment *this)

{
  byte bVar1;
  double dVar2;
  uint8_t local_3f [7];
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  local_3f[6] = 1;
  local_10 = getHuMomentInvariant(this,local_3f + 6);
  local_3f[5] = 2;
  local_20 = getHuMomentInvariant(this,local_3f + 5);
  local_3f[4] = 3;
  local_28 = getHuMomentInvariant(this,local_3f + 4);
  local_3f[3] = 4;
  local_30 = getHuMomentInvariant(this,local_3f + 3);
  local_3f[2] = 5;
  local_18 = getHuMomentInvariant(this,local_3f + 2);
  local_3f[1] = 6;
  local_38 = getHuMomentInvariant(this,local_3f + 1);
  local_3f[0] = '\a';
  dVar2 = getHuMomentInvariant(this,local_3f);
  bVar1 = 0;
  if ((0.29249645 <= local_10) && (bVar1 = 0, local_10 <= 0.62405175)) {
    bVar1 = 0;
    if ((0.00128345 <= local_20) && (local_20 <= 0.1776243)) {
      bVar1 = 0;
      if ((0.015959 <= local_28) && (local_28 <= 0.2128749)) {
        bVar1 = 0;
        if ((6.365e-05 <= local_30) &&
           (((local_30 <= 0.05175975 && (bVar1 = 0, -1e-06 <= local_18)) && (local_18 <= 0.0051639))
           )) {
          bVar1 = 0;
          if ((-1e-06 <= local_38) && (local_38 <= 0.018841200000000002)) {
            bVar1 = -(0.0210235 <= dVar2) & -(dVar2 <= 0.06406785000000001);
          }
        }
      }
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

const bool
Segment::isLetterT()
const
{
    const auto hu1 = this->getHuMomentInvariant(1);
    const auto hu2 = this->getHuMomentInvariant(2);
    const auto hu3 = this->getHuMomentInvariant(3);
    const auto hu4 = this->getHuMomentInvariant(4);
    const auto hu5 = this->getHuMomentInvariant(5);
    const auto hu6 = this->getHuMomentInvariant(6);
    const auto hu7 = this->getHuMomentInvariant(7);

    if (hu1 < 0.307891 * 0.95 || hu1 > 0.594335 * 1.05) {
        return false;
    }
    if (hu2 < 0.001351 * 0.95 || hu2 > 0.169166 * 1.05) {
        return false;
    }
    if (hu3 < 0.015959 * 1 || hu3 > 0.202738 * 1.05) {
        return false;
    }
    if (hu4 < 0.000067 * 0.95 || hu4 > 0.049295 * 1.05) {
        return false;
    }
    if (hu5 < -0.000001 || hu5 > 0.004918 * 1.05) {
        return false;
    }
    if (hu6 < -0.000001 || hu6 > 0.017944 * 1.05) {
        return false;
    }
    if (hu7 < 0.02213 * 0.95 || hu7 > 0.061017 * 1.05) {
        return false;
    }

    return true;
}